

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-alloc-cb-fail.c
# Opt level: O1

void sv_recv_cb(uv_udp_t *handle,ssize_t nread,uv_buf_t *rcvbuf,sockaddr *addr,uint flags)

{
  bool bVar1;
  int iVar2;
  ssize_t *psVar3;
  ssize_t **ppsVar4;
  int64_t eval_b;
  int64_t eval_a;
  ssize_t local_10;
  ssize_t *local_8;
  
  iVar2 = recv_cnt + 1;
  bVar1 = recv_cnt < 4;
  psVar3 = (ssize_t *)nread;
  recv_cnt = iVar2;
  if (bVar1) {
    local_8 = (ssize_t *)0xa;
    if (nread == 10) {
      return;
    }
    psVar3 = &local_10;
    local_10 = nread;
    sv_recv_cb_cold_2();
  }
  local_10 = 0;
  if (psVar3 == (ssize_t *)0x0) {
    return;
  }
  ppsVar4 = &local_8;
  local_8 = psVar3;
  sv_recv_cb_cold_1();
  iVar2 = uv_is_closing();
  if (iVar2 == 0) {
    uv_close(ppsVar4,0);
    return;
  }
  return;
}

Assistant:

static void sv_recv_cb(uv_udp_t* handle,
                       ssize_t nread,
                       const uv_buf_t* rcvbuf,
                       const struct sockaddr* addr,
                       unsigned flags) {
  uv_udp_send_t* req;
  uv_buf_t sndbuf;
  int r;

  if (nread < 0) {
    ASSERT(0 && "unexpected error");
  }

  if (nread == 0) {
    /* Returning unused buffer. Don't count towards sv_recv_cb_called */
    ASSERT_NULL(addr);
    return;
  }

  CHECK_HANDLE(handle);
  ASSERT_OK(flags);

  ASSERT_NOT_NULL(addr);
  ASSERT_EQ(4, nread);
  ASSERT(!memcmp("PING", rcvbuf->base, nread));

  r = uv_udp_recv_stop(handle);
  ASSERT_OK(r);

  req = malloc(sizeof *req);
  ASSERT_NOT_NULL(req);

  sndbuf = uv_buf_init("PONG", 4);
  r = uv_udp_send(req, handle, &sndbuf, 1, addr, sv_send_cb);
  ASSERT_OK(r);

  sv_recv_cb_called++;
}